

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void last_valueInvFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  int *piVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)sqlite3_aggregate_context(pCtx,0x10);
  if (puVar2 != (undefined8 *)0x0) {
    piVar1 = (int *)(puVar2 + 1);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      sqlite3ValueFree((sqlite3_value *)*puVar2);
      *puVar2 = 0;
    }
  }
  return;
}

Assistant:

static void last_valueInvFunc(
  sqlite3_context *pCtx, 
  int nArg,
  sqlite3_value **apArg
){
  struct LastValueCtx *p;
  UNUSED_PARAMETER(nArg);
  UNUSED_PARAMETER(apArg);
  p = (struct LastValueCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( ALWAYS(p) ){
    p->nVal--;
    if( p->nVal==0 ){
      sqlite3_value_free(p->pVal);
      p->pVal = 0;
    }
  }
}